

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqllogictest.cpp
# Opt level: O0

string * ParseGroupFromPath(string *file)

{
  long lVar1;
  char *pcVar2;
  char *in_RSI;
  string *in_RDI;
  idx_t i;
  int group_end;
  int group_begin;
  string extension;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  allocator *paVar3;
  string local_160 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  long local_60;
  int local_54;
  int local_50;
  undefined4 local_4c;
  allocator local_45 [20];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,anon_var_dwarf_6601ab + 9,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  lVar1 = std::__cxx11::string::find(in_RSI,0x8c2192);
  if (lVar1 != -1) {
    std::__cxx11::string::operator=(local_30,"[.]");
  }
  lVar1 = std::__cxx11::string::find(in_RSI,0x8c219d);
  if (lVar1 == -1) {
    local_50 = -1;
    local_54 = -1;
    for (local_60 = std::__cxx11::string::size(); local_60 != 0; local_60 = local_60 + -1) {
      in_stack_fffffffffffffe70 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::operator[]((ulong)in_RSI);
      if (in_stack_fffffffffffffe70->_M_dataplus == (_Alloc_hider)0x2f) {
LAB_007dd738:
        if (local_54 != -1) {
          local_50 = (int)local_60;
          std::__cxx11::string::substr((ulong)local_c0,(ulong)in_RSI);
          std::operator+((char *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
          std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
          std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
          std::__cxx11::string::~string(local_80);
          std::__cxx11::string::~string(local_a0);
          std::__cxx11::string::~string(local_c0);
          goto LAB_007dda71;
        }
        local_54 = (int)local_60 + -1;
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
        if (*pcVar2 == '\\') goto LAB_007dd738;
      }
    }
    if (local_54 == -1) {
      std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
      std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_100);
    }
    else {
      std::__cxx11::string::substr((ulong)local_160,(ulong)in_RSI);
      std::operator+((char *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
      std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_160);
    }
  }
  else {
    paVar3 = local_45;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"[coverage][.]",paVar3);
    std::allocator<char>::~allocator((allocator<char> *)local_45);
  }
LAB_007dda71:
  local_4c = 1;
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

static string ParseGroupFromPath(string file) {
	string extension = "";
	if (file.find(".test_slow") != std::string::npos) {
		// "slow" in the name indicates a slow test (i.e. only run as part of allunit)
		extension = "[.]";
	}
	if (file.find(".test_coverage") != std::string::npos) {
		// "coverage" in the name indicates a coverage test (i.e. only run as part of coverage)
		return "[coverage][.]";
	}
	// move backwards to the last slash
	int group_begin = -1, group_end = -1;
	for (idx_t i = file.size(); i > 0; i--) {
		if (file[i - 1] == '/' || file[i - 1] == '\\') {
			if (group_end == -1) {
				group_end = i - 1;
			} else {
				group_begin = i;
				return "[" + file.substr(group_begin, group_end - group_begin) + "]" + extension;
			}
		}
	}
	if (group_end == -1) {
		return "[" + file + "]" + extension;
	}
	return "[" + file.substr(0, group_end) + "]" + extension;
}